

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.hpp
# Opt level: O1

Comparison __thiscall Kernel::TermList::Top::compare(Top *this,Top *other)

{
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:647:37),_Constant<0>_>
  RVar1;
  byte bVar2;
  byte bVar3;
  anon_class_16_2_441c8d4f f;
  
  bVar2 = *(byte *)&(this->_inner)._inner & 1;
  bVar3 = *(byte *)&(other->_inner)._inner & 1;
  if (bVar2 != bVar3) {
    return -(uint)(bVar2 < bVar3) | GREATER;
  }
  f.rhs = &other->_inner;
  f.lhs = &this->_inner;
  RVar1 = ::Lib::CoproductImpl::RawCoproduct<Kernel::VarNumber,Kernel::SymbolId>::operator()
                    ((RawCoproduct<Kernel::VarNumber,Kernel::SymbolId> *)this,f);
  return RVar1;
}

Assistant:

Lib::Comparison compare(Top const& other) const 
    { return _inner.compare(other._inner); }